

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateView(Catalog *this,CatalogTransaction transaction,CreateViewInfo *info)

{
  CatalogTransaction transaction_00;
  SchemaCatalogEntry *pSVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  string *in_RSI;
  Catalog *in_RDI;
  CatalogTransaction in_stack_00000000;
  SchemaCatalogEntry *schema;
  undefined1 local_70 [24];
  CreateViewInfo *in_stack_ffffffffffffffa8;
  SchemaCatalogEntry *in_stack_ffffffffffffffb0;
  Catalog *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  memcpy(&stack0xffffffffffffffb8,&stack0x00000008,0x28);
  pSVar1 = GetSchema(in_RDI,in_stack_00000000,in_RSI);
  memcpy(local_70,&stack0x00000008,0x28);
  transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffffd8;
  transaction_00.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffffd0;
  transaction_00.transaction.ptr = (Transaction *)pSVar1;
  transaction_00.transaction_id = (transaction_t)in_RSI;
  transaction_00.start_time = (transaction_t)in_RDI;
  oVar2 = CreateView(in_stack_ffffffffffffffb8,transaction_00,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateView(CatalogTransaction transaction, CreateViewInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	return CreateView(transaction, schema, info);
}